

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_filehandle.cc
# Opt level: O3

RC __thiscall
PF_FileHandle::GetThisPage(PF_FileHandle *this,PageNum pageNum,PF_PageHandle *pageHandle)

{
  RC RVar1;
  RC RVar2;
  char *pPageBuf;
  int *local_20;
  
  if (this->bFileOpen != 0) {
    RVar1 = 3;
    if ((-1 < pageNum) && (pageNum < (this->hdr).numPages)) {
      RVar1 = PF_BufferMgr::GetPage(this->pBufferMgr,this->unixfd,pageNum,(char **)&local_20,1);
      if (RVar1 == 0) {
        if (*local_20 == -2) {
          pageHandle->pageNum = pageNum;
          pageHandle->pPageData = (char *)(local_20 + 1);
          RVar1 = 0;
        }
        else {
          RVar2 = UnpinPage(this,pageNum);
          RVar1 = 3;
          if (RVar2 != 0) {
            RVar1 = RVar2;
          }
        }
      }
    }
    return RVar1;
  }
  return 5;
}

Assistant:

RC PF_FileHandle::GetThisPage(PageNum pageNum, PF_PageHandle &pageHandle) const
{
   int  rc;               // return code
   char *pPageBuf;        // address of page in buffer pool

   // File must be open
   if (!bFileOpen)
      return (PF_CLOSEDFILE);

   // Validate page number
   if (!IsValidPageNum(pageNum))
      return (PF_INVALIDPAGE);

   // Get this page from the buffer manager
   if ((rc = pBufferMgr->GetPage(unixfd, pageNum, &pPageBuf)))
      return (rc);

   // If the page is valid, then set pageHandle to this page and return ok
   if (((PF_PageHdr*)pPageBuf)->nextFree == PF_PAGE_USED) {

      // Set the pageHandle local variables
      pageHandle.pageNum = pageNum;
      pageHandle.pPageData = pPageBuf + sizeof(PF_PageHdr);

      // Return ok
      return (0);
   }

   // If the page is *not* a valid one, then unpin the page
   if ((rc = UnpinPage(pageNum)))
      return (rc);

   return (PF_INVALIDPAGE);
}